

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_piece_hashed
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  initializer_list<int> __l;
  size_t *psVar1;
  per_timer_data *ppVar2;
  storage_error *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  torrent_info *ptVar8;
  long lVar9;
  session_settings *this_01;
  info_hash_t *piVar10;
  element_type *peVar11;
  pointer ppVar12;
  alert_manager *paVar13;
  file_storage *pfVar14;
  undefined4 extraout_var_01;
  bool local_422;
  byte local_3fa;
  bool local_2da;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_2c4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_2c0;
  pause_flags_t local_2b9;
  int local_2b8;
  int local_2b4;
  int num_torrents;
  int local_2ac;
  iterator local_2a8;
  undefined8 local_2a0;
  int local_294;
  anon_class_8_1_89900f17 aStack_290;
  int limit;
  anon_class_8_1_89900f17 get_int_setting;
  session_settings *pack;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_270;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
  local_258;
  uchar local_231;
  undefined8 local_230;
  undefined8 local_228;
  int local_220;
  uint local_21c;
  undefined1 local_218 [8];
  span<libtorrent::digest32<256L>_> v2_span;
  bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> local_1fd;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1fc;
  undefined1 local_1f8 [3];
  bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> flags;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1e4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1e0;
  int local_1dc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1d8;
  int local_1d4;
  piece_block local_1d0;
  int local_1c8;
  int local_1c4;
  int i;
  int blocks_in_piece;
  value_t local_1b0;
  int local_1ac;
  undefined1 local_1a5;
  int local_1a4;
  value_t local_1a0;
  value_t local_19c;
  tribool local_198;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_194;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_190;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_18c;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_188;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_184;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_180;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_17c;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_178;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_174;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_170;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_16c;
  span<const_libtorrent::digest32<256L>_> local_168;
  piece_index_t local_154;
  value_t local_150;
  value_t local_14c;
  tribool local_148;
  int local_144;
  sha1_hash local_140;
  tribool local_12c;
  tribool local_128;
  tribool local_124;
  tribool hash_passed [2];
  string local_118;
  undefined1 local_f8 [24];
  string local_e0;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_c0;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_bc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_b8;
  int local_b4;
  wait_op *pwStack_b0;
  int diff;
  int local_a8;
  int local_9c;
  undefined1 local_98 [16];
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_88 [2];
  piece_index_t last;
  int64_t file_size;
  file_storage *st;
  error_code local_60;
  error_condition local_50 [2];
  per_timer_data *local_30;
  storage_error *error_local;
  sha1_hash *piece_hash_local;
  vector<sha256_hash> *block_hashes_local;
  torrent *this_local;
  piece_index_t piece_local;
  
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
     ((*(uint *)&this->field_0x5dd >> 0x1a & 1) == 0)) {
    local_30 = (per_timer_data *)error;
    error_local = (storage_error *)piece_hash;
    piece_hash_local = (sha1_hash *)block_hashes;
    block_hashes_local = (vector<sha256_hash> *)this;
    this_local._4_4_ = piece.m_val;
    state_updated(this);
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
              (&this->m_num_checked_pieces);
    bVar3 = storage_error::operator_cast_to_bool((storage_error *)local_30);
    ppVar2 = local_30;
    if (bVar3) {
      boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                (local_50,no_such_file_or_directory,(type *)0x0);
      bVar3 = boost::system::operator==((error_code *)ppVar2,local_50);
      ppVar2 = local_30;
      local_2da = true;
      if (!bVar3) {
        boost::system::error_code::error_code<boost::asio::error::misc_errors>
                  (&local_60,eof,(type *)0x0);
        bVar3 = boost::system::operator==((error_code *)ppVar2,&local_60);
        ppVar2 = local_30;
        local_2da = true;
        if (!bVar3) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&st,file_too_short,(type *)0x0);
          local_2da = boost::system::operator==((error_code *)ppVar2,(error_code *)&st);
        }
      }
      if (local_2da == false) {
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_bc,0);
        (this->m_checking_piece).m_val = local_bc.m_val;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_c0,0);
        (this->m_num_checked_pieces).m_val = local_c0.m_val;
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        bVar3 = alert_manager::should_post<libtorrent::file_error_alert>
                          ((alert_manager *)CONCAT44(extraout_var,iVar4));
        if (bVar3) {
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          ppVar2 = local_30;
          local_f8._20_4_ = storage_error::file((storage_error *)local_30);
          resolve_filename_abi_cxx11_
                    ((string *)(local_f8 + 0x18),this,(file_index_t)local_f8._20_4_);
          psVar1 = &local_30->heap_index_;
          get_handle((torrent *)local_f8);
          alert_manager::
          emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                    ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(error_code *)ppVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_f8 + 0x18),(operation_t *)((long)psVar1 + 3),(torrent_handle *)local_f8)
          ;
          torrent_handle::~torrent_handle((torrent_handle *)local_f8);
          ::std::__cxx11::string::~string((string *)(local_f8 + 0x18));
        }
        uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
        if ((uVar6 & 1) != 0) {
          uVar6 = boost::system::error_code::value((error_code *)local_30);
          boost::system::error_code::message_abi_cxx11_(&local_118,(error_code *)local_30);
          uVar7 = ::std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"on_piece_hashed, fatal disk error: (%d) %s",(ulong)uVar6,uVar7);
          ::std::__cxx11::string::~string((string *)&local_118);
        }
        auto_managed(this,false);
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
        bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
                      ((long)&hash_passed[1].value + 3));
        pause(this);
        ppVar2 = local_30;
        hash_passed[0].value = (value_t)storage_error::file((storage_error *)local_30);
        set_error(this,(error_code *)ppVar2,(file_index_t)hash_passed[0].value);
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x2c])();
        return;
      }
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      pfVar14 = torrent_info::files(peVar11);
      local_88[1].m_val = (int)storage_error::file((storage_error *)local_30);
      _last = (object_fns *)file_storage::file_size(pfVar14,(file_index_t)local_88[1].m_val);
      local_9c = (int)storage_error::file((storage_error *)local_30);
      _pwStack_b0 = file_storage::map_file(pfVar14,(file_index_t)local_9c,(int64_t)_last,0);
      local_98._0_4_ = pwStack_b0._0_4_;
      local_88[0].m_val = local_98._0_4_;
      local_98._0_12_ = (undefined1  [12])_pwStack_b0;
      bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        (&this->m_checking_piece,local_88);
      if (bVar3) {
        iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)local_88);
        local_b4 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_checking_piece);
        local_b4 = iVar4 - local_b4;
        iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_num_checked_pieces);
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  (&local_b8,iVar4 + local_b4);
        (this->m_num_checked_pieces).m_val = local_b8.m_val;
        (this->m_checking_piece).m_val = local_88[0].m_val;
      }
    }
    iVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_num_checked_pieces);
    ptVar8 = torrent_file(this);
    iVar5 = torrent_info::num_pieces(ptVar8);
    lVar9 = ((long)iVar4 * 1000000) / (long)iVar5;
    *(short *)&this->field_0x604 = (short)lVar9;
    this->field_0x606 = this->field_0x606 & 0xf0 | (byte)((ulong)lVar9 >> 0x10) & 0xf;
    boost::logic::tribool::tribool(&local_128,boost::logic::indeterminate);
    boost::logic::tribool::tribool(&local_124,boost::logic::indeterminate);
    this_01 = settings(this);
    bVar3 = session_settings::get_bool(this_01,0x8016);
    if (bVar3) {
      boost::logic::tribool::tribool((tribool *)&local_16c,true);
      local_124.value = local_16c.m_val;
      local_128.value = local_16c.m_val;
    }
    else {
      ptVar8 = torrent_file(this);
      piVar10 = torrent_info::info_hashes(ptVar8);
      bVar3 = info_hash_t::has_v1(piVar10);
      this_00 = error_local;
      if (bVar3) {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        local_144 = this_local._4_4_;
        torrent_info::hash_for_piece(&local_140,peVar11,this_local._4_4_);
        bVar3 = digest32<160L>::operator==((digest32<160L> *)this_00,&local_140);
        boost::logic::tribool::tribool(&local_12c,bVar3);
        local_128.value = local_12c.value;
      }
      ptVar8 = torrent_file(this);
      piVar10 = torrent_info::info_hashes(ptVar8);
      bVar3 = info_hash_t::has_v2(piVar10);
      local_3fa = 0;
      if (bVar3) {
        local_14c = local_128.value;
        local_148 = boost::logic::operator==(local_128,false);
        bVar3 = boost::logic::tribool::operator_cast_to_bool(&local_148);
        local_3fa = bVar3 ^ 0xff;
      }
      if ((local_3fa & 1) != 0) {
        local_154.m_val = this_local._4_4_;
        span<libtorrent::digest32<256l>const>::
        span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                  ((span<libtorrent::digest32<256l>const> *)&local_168,block_hashes);
        local_150 = (value_t)on_blocks_hashed(this,local_154,local_168);
        local_124 = (tribool)local_150;
      }
    }
    local_178.m_val = local_128.value;
    local_180.m_val = local_124.value;
    local_17c.m_val = (uint)boost::logic::operator!(local_124);
    local_174.m_val = (uint)boost::logic::operator&&(local_178.m_val,(tribool)local_17c.m_val);
    local_18c.m_val = local_128.value;
    local_188.m_val = (uint)boost::logic::operator!(local_128);
    local_190.m_val = local_124.value;
    local_184.m_val = (uint)boost::logic::operator&&((tribool)local_188.m_val,local_124);
    local_170.m_val = (uint)boost::logic::operator||(local_174.m_val,(tribool)local_184.m_val);
    bVar3 = boost::logic::tribool::operator_cast_to_bool((tribool *)&local_170);
    if (bVar3) {
      local_194.m_val = this_local._4_4_;
      handle_inconsistent_hashes(this,this_local._4_4_);
    }
    else {
      local_19c = local_128.value;
      local_1a0 = local_124.value;
      local_198 = boost::logic::operator||(local_128,local_124);
      bVar3 = boost::logic::tribool::operator_cast_to_bool(&local_198);
      if (bVar3) {
        bVar3 = has_picker(this);
        if ((bVar3) || ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) == 0))
        {
          need_picker(this);
          ppVar12 = ::std::
                    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                    ::operator->(&(this->super_torrent_hot_members).m_picker);
          local_1a4 = this_local._4_4_;
          piece_picker::we_have(ppVar12,this_local._4_4_);
          local_1a5 = 0x10;
          set_need_save_resume(this,(resume_data_flags_t)0x10);
          update_gauge(this);
        }
        local_1ac = this_local._4_4_;
        we_have(this,this_local._4_4_,false);
      }
      else {
        bVar3 = storage_error::operator_cast_to_bool((storage_error *)local_30);
        if (!bVar3) {
          local_1b0 = local_128.value;
          bVar3 = boost::logic::indeterminate(local_128.value);
          if (bVar3) {
            blocks_in_piece = local_124.value;
            bVar3 = boost::logic::indeterminate(local_124.value);
            if (bVar3) {
              need_picker(this);
              ppVar12 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              local_1c4 = this_local._4_4_;
              i = piece_picker::blocks_in_piece(ppVar12,this_local._4_4_);
              for (local_1c8 = 0; local_1c8 < i; local_1c8 = local_1c8 + 1) {
                ppVar12 = ::std::
                          unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ::operator->(&(this->super_torrent_hot_members).m_picker);
                local_1d4 = this_local._4_4_;
                piece_block::piece_block(&local_1d0,this_local._4_4_,local_1c8);
                piece_picker::mark_as_finished(ppVar12,local_1d0,(torrent_peer *)0x0);
              }
            }
          }
        }
      }
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      local_1d8.m_val = (int)torrent_info::end_piece(peVar11);
      bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        (&this->m_checking_piece,&local_1d8);
      local_422 = false;
      if (bVar3) {
        local_422 = has_picker(this);
      }
      if (local_422 != false) {
        do {
          ppVar12 = ::std::
                    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                    ::operator->(&(this->super_torrent_hot_members).m_picker);
          local_1dc = (this->m_checking_piece).m_val;
          bVar3 = piece_picker::have_piece(ppVar12,(piece_index_t)local_1dc);
          if (!bVar3) break;
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                    (&this->m_checking_piece);
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                    (&this->m_num_checked_pieces);
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&(this->super_torrent_hot_members).m_torrent_file);
          local_1e0.m_val = (int)torrent_info::end_piece(peVar11);
          bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                            (&this->m_checking_piece,&local_1e0);
        } while (!bVar3);
      }
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      local_1e4.m_val = (int)torrent_info::end_piece(peVar11);
      bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        (&this->m_num_checked_pieces,&local_1e4);
      if (bVar3) {
        bVar3 = should_check_files(this);
        if (bVar3) {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&(this->super_torrent_hot_members).m_torrent_file);
          local_1fc.m_val = (int)torrent_info::end_piece(peVar11);
          bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                            (&this->m_checking_piece,&local_1fc);
          if (!bVar3) {
            local_1fd = libtorrent::flags::operator|
                                  ((bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>
                                    )0x8,(bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>
                                          )0x10);
            ptVar8 = torrent_file(this);
            piVar10 = torrent_info::info_hashes(ptVar8);
            bVar3 = info_hash_t::has_v1(piVar10);
            if (bVar3) {
              libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>
              ::operator|=(&local_1fd,
                           (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)' ');
            }
            ptVar8 = torrent_file(this);
            piVar10 = torrent_info::info_hashes(ptVar8);
            bVar3 = info_hash_t::has_v2(piVar10);
            if (bVar3) {
              ptVar8 = torrent_file(this);
              pfVar14 = torrent_info::orig_files(ptVar8);
              v2_span.m_len._4_4_ = (this->m_checking_piece).m_val;
              iVar4 = file_storage::blocks_in_piece2(pfVar14,v2_span.m_len._4_4_);
              container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
              ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                                  *)block_hashes,iVar4);
            }
            span<libtorrent::digest32<256l>>::
            span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>> *)local_218,block_hashes);
            iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[4])();
            local_21c = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
            local_220 = (this->m_checking_piece).m_val;
            span<libtorrent::digest32<256l>>::
            span<libtorrent::span<libtorrent::digest32<256l>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>> *)&local_230,
                       (span<libtorrent::digest32<256L>_> *)local_218);
            local_231 = local_1fd.m_val;
            ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                      ((enable_shared_from_this<libtorrent::aux::torrent> *)&pack);
            container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
            ::container_wrapper(&local_270,block_hashes);
            ::std::
            function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
            ::
            function<libtorrent::aux::torrent::on_piece_hashed(libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)::__0,void>
                      ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
                        *)&local_258,(anon_class_40_2_950b2f52 *)&pack);
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var_01,iVar4),local_21c,local_220,local_230,
                       local_228,local_231,&local_258);
            ::std::
            function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
            ::~function(&local_258);
            on_piece_hashed(libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)
            ::$_0::~__0((__0 *)&pack);
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      (&this->m_checking_piece);
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1f])();
            uVar6 = strong_typedef::operator_cast_to_int((strong_typedef *)&this->m_checking_piece);
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this,"on_piece_hashed, m_checking_piece: %d",(ulong)uVar6);
          }
        }
        else {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"on_piece_hashed, checking paused");
          bVar3 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                            (&this->m_checking_piece,&this->m_num_checked_pieces);
          if (bVar3) {
            paVar13 = alerts(this);
            bVar3 = alert_manager::should_post<libtorrent::torrent_paused_alert>(paVar13);
            if (bVar3) {
              paVar13 = alerts(this);
              get_handle((torrent *)local_1f8);
              alert_manager::
              emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                        (paVar13,(torrent_handle *)local_1f8);
              torrent_handle::~torrent_handle((torrent_handle *)local_1f8);
            }
          }
        }
      }
      else {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"on_piece_hashed, completed");
        aStack_290.pack = settings(this);
        get_int_setting.pack = aStack_290.pack;
        local_2b4 = on_piece_hashed::anon_class_8_1_89900f17::operator()
                              (&stack0xfffffffffffffd70,0x4029);
        num_torrents = on_piece_hashed::anon_class_8_1_89900f17::operator()
                                 (&stack0xfffffffffffffd70,0x402a);
        local_2ac = on_piece_hashed::anon_class_8_1_89900f17::operator()
                              (&stack0xfffffffffffffd70,0x402f);
        local_2a8 = &local_2b4;
        local_2a0 = 3;
        __l._M_len = 3;
        __l._M_array = local_2a8;
        local_294 = ::std::min<int>(__l);
        local_2b8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x1c])();
        if (((*(uint *)&this->field_0x600 & 1) != 0) && (local_294 < local_2b8)) {
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
          bitfield_flag(&local_2b9);
          set_paused(this,true,local_2b9);
        }
        files_checked(this);
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_2c0,0);
        (this->m_checking_piece).m_val = local_2c0.m_val;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_2c4,0);
        (this->m_num_checked_pieces).m_val = local_2c4.m_val;
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_hashed(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece, sha1_hash const& piece_hash
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort) return;
		if (m_deleted) return;

		state_updated();

		++m_num_checked_pieces;

		if (error)
		{
			if (error.ec == boost::system::errc::no_such_file_or_directory
				|| error.ec == boost::asio::error::eof
				|| error.ec == lt::errors::file_too_short
#ifdef TORRENT_WINDOWS
				|| error.ec == error_code(ERROR_HANDLE_EOF, system_category())
#endif
				)
			{
				TORRENT_ASSERT(error.file() >= file_index_t(0));

				// skip this file by updating m_checking_piece to the first piece following it
				file_storage const& st = m_torrent_file->files();
				std::int64_t file_size = st.file_size(error.file());
				piece_index_t last = st.map_file(error.file(), file_size, 0).piece;
				if (m_checking_piece < last)
				{
					int diff = static_cast<int>(last) - static_cast<int>(m_checking_piece);
					m_num_checked_pieces = piece_index_t(static_cast<int>(m_num_checked_pieces) + diff);
					m_checking_piece = last;
				}
			}
			else
			{
				m_checking_piece = piece_index_t{0};
				m_num_checked_pieces = piece_index_t{0};
				if (m_ses.alerts().should_post<file_error_alert>())
					m_ses.alerts().emplace_alert<file_error_alert>(error.ec,
						resolve_filename(error.file()), error.operation, get_handle());

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("on_piece_hashed, fatal disk error: (%d) %s", error.ec.value()
						, error.ec.message().c_str());
				}
#endif
				auto_managed(false);
				pause();
				set_error(error.ec, error.file());

				// recalculate auto-managed torrents sooner
				// in order to start checking the next torrent
				m_ses.trigger_auto_manage();
				return;
			}
		}

		m_progress_ppm = std::uint32_t(std::int64_t(static_cast<int>(m_num_checked_pieces))
			* 1000000 / torrent_file().num_pieces());

		boost::tribool hash_passed[2]
			= { boost::indeterminate, boost::indeterminate };

		if (!settings().get_bool(settings_pack::disable_hash_checks))
		{
			if (torrent_file().info_hashes().has_v1())
				hash_passed[0] = piece_hash == m_torrent_file->hash_for_piece(piece);

			// if the v1 hash failed the check, don't add the v2 hashes to the
			// merkle tree. They are most likely invalid.
			if (torrent_file().info_hashes().has_v2() && !bool(hash_passed[0] == false))
			{
				hash_passed[1] = on_blocks_hashed(piece, block_hashes);
			}
		}
		else
		{
			hash_passed[0] = hash_passed[1] = true;
		}

		if ((hash_passed[0] && !hash_passed[1]) || (!hash_passed[0] && hash_passed[1]))
		{
			handle_inconsistent_hashes(piece);
			return;
		}
		else if (hash_passed[0] || hash_passed[1])
		{
			if (has_picker() || !m_have_all)
			{
				need_picker();
				m_picker->we_have(piece);
				set_need_save_resume(torrent_handle::if_download_progress);
				update_gauge();
			}
			we_have(piece);
		}
		else if (!error
			&& boost::indeterminate(hash_passed[0])
			&& boost::indeterminate(hash_passed[1]))
		{
			// The data exists but we don't have the hashes needed to verify
			// it yet. This is a special case because we want to say we have
			// the piece once the hash is verified and not download the data
			// unless the hash check fails. To get this effect we setup the
			// piece's state in the piece picker so that it looks like a piece
			// which is finished but not hash checked.
			need_picker();
			int const blocks_in_piece = m_picker->blocks_in_piece(piece);
			for (int i = 0; i < blocks_in_piece; ++i)
				m_picker->mark_as_finished(piece_block(piece, i), nullptr);
		}

		if (m_checking_piece < m_torrent_file->end_piece() && has_picker())
		{
			// skip pieces we already have
			while (m_picker->have_piece(m_checking_piece))
			{
				++m_checking_piece;
				++m_num_checked_pieces;
				if (m_checking_piece >= m_torrent_file->end_piece())
				{
					// actually, we already have outstanding jobs for
					// the remaining pieces. We just need to wait for them
					// to finish
					break;
				}
			}
		}

		if (m_num_checked_pieces < m_torrent_file->end_piece())
		{
			// we paused the checking
			if (!should_check_files())
			{
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("on_piece_hashed, checking paused");
#endif
				if (m_checking_piece == m_num_checked_pieces)
				{
					// we are paused, and we just completed the last outstanding job.
					// now we can be considered paused
					if (alerts().should_post<torrent_paused_alert>())
						alerts().emplace_alert<torrent_paused_alert>(get_handle());
				}
				return;
			}

			if (m_checking_piece >= m_torrent_file->end_piece())
				return;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;

			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			if (torrent_file().info_hashes().has_v2())
				block_hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(block_hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes = std::move(block_hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& e)
				{ self->on_piece_hashed(std::move(hashes), p, h, e); });
			++m_checking_piece;
			m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("on_piece_hashed, m_checking_piece: %d"
				, static_cast<int>(m_checking_piece));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("on_piece_hashed, completed");
#endif

		auto const& pack = settings();
		auto get_int_setting = [&pack](int const name) {
			int const v = pack.get_int(name);
			if (v < 0) return std::numeric_limits<int>::max();
			return v;
		};
		int const limit = std::min({
			get_int_setting(settings_pack::active_downloads)
			, get_int_setting(settings_pack::active_seeds)
			, get_int_setting(settings_pack::active_limit)});
		int const num_torrents = m_ses.num_torrents();
		if (m_auto_managed && num_torrents > limit)
		{
			// if we're auto managed and we've reached one of the limits. Assume
			// we need to be paused until the auto managed logic runs again
			// (which is triggered further down)
			set_paused(true);
		}

		// we're done checking! (this should cause a call to trigger_auto_manage)
		files_checked();

		// reset the checking state
		m_checking_piece = piece_index_t(0);
		m_num_checked_pieces = piece_index_t(0);
	}
	catch (...) { handle_exception(); }